

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_scan_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  parasail_result_t *ppVar9;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *ptr_00;
  __m128i *ptr_01;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  __m128i *palVar15;
  long lVar16;
  char *pcVar17;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  size_t sVar18;
  uint uVar19;
  ulong uVar20;
  char *__format;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  size_t __n;
  bool bVar24;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar43;
  int iVar44;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar46;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  __m128i c;
  __m128i c_00;
  uint local_158;
  int local_154;
  long local_150;
  size_t len;
  uint uVar47;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar17 = "profile";
  }
  else {
    pvVar2 = (profile->profile32).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar17 = "profile->profile32.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar17 = "profile->matrix";
      }
      else {
        uVar21 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar17 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar17 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar17 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar17 = "open";
        }
        else {
          if (-1 < gap) {
            iVar11 = ppVar3->min;
            uVar23 = 0x80000000 - iVar11;
            if (iVar11 != -open && SBORROW4(iVar11,-open) == iVar11 + open < 0) {
              uVar23 = open | 0x80000000;
            }
            iVar8 = 0x7ffffffe - ppVar3->max;
            ppVar9 = parasail_result_new_table1((uint)(uVar21 + 3) & 0x7ffffffc,s2Len);
            if (ppVar9 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar20 = uVar21 + 3 >> 2;
            ppVar9->flag = ppVar9->flag | 0x4420404;
            b = parasail_memalign___m128i(0x10,uVar20);
            ptr = parasail_memalign___m128i(0x10,uVar20);
            b_00 = parasail_memalign___m128i(0x10,uVar20);
            ptr_00 = parasail_memalign___m128i(0x10,uVar20);
            ptr_01 = parasail_memalign___m128i(0x10,uVar20);
            auVar58._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
            auVar58._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar58._8_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0 && (int)b_00 == 0);
            auVar58._12_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
            iVar11 = movmskps(iVar11,auVar58);
            if (iVar11 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar23 = uVar23 + 1;
            uVar19 = (uint)uVar20;
            uVar12 = -(gap * uVar19);
            len = (size_t)uVar12;
            c[1] = extraout_RDX;
            c[0] = uVar20;
            parasail_memset___m128i(b_00,c,len);
            c_00[1] = extraout_RDX_00;
            c_00[0] = uVar20;
            parasail_memset___m128i(b,c_00,len);
            iVar11 = -open;
            iVar31 = -open;
            iVar32 = -open;
            iVar33 = -open;
            for (uVar13 = uVar19 - 1; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
              palVar15 = ptr_01 + uVar13;
              *(int *)*palVar15 = iVar11;
              *(int *)((long)*palVar15 + 4) = iVar31;
              *(int *)(*palVar15 + 1) = iVar32;
              *(int *)((long)*palVar15 + 0xc) = iVar33;
              iVar11 = iVar11 - gap;
              iVar31 = iVar31 - gap;
              iVar32 = iVar32 - gap;
              iVar33 = iVar33 - gap;
            }
            palVar15 = b_00 + (uVar19 - 1);
            uVar10 = (ulong)(uint)s2Len;
            __n = uVar20 << 4;
            lVar22 = uVar20 * uVar10;
            local_150 = 0;
            auVar51._4_4_ = iVar8;
            auVar51._0_4_ = iVar8;
            auVar51._8_4_ = iVar8;
            auVar51._12_4_ = iVar8;
            auVar63._4_4_ = uVar23;
            auVar63._0_4_ = uVar23;
            auVar63._8_4_ = uVar23;
            auVar63._12_4_ = uVar23;
            local_154 = 0;
            auVar58 = auVar63;
            auVar42 = auVar63;
            local_158 = uVar23;
            for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
              iVar11 = ppVar3->mapper[(byte)s2[uVar20]];
              auVar34 = (undefined1  [16])0x0;
              sVar18 = 0;
              auVar25._4_4_ = uVar23;
              auVar25._0_4_ = uVar23;
              auVar25._8_4_ = uVar23;
              auVar25._12_4_ = uVar23;
              iVar31 = 0;
              iVar32 = (int)(*palVar15)[0];
              iVar33 = *(int *)((long)*palVar15 + 4);
              iVar14 = (int)(*palVar15)[1];
              while( true ) {
                iVar43 = auVar34._0_4_;
                iVar44 = auVar34._4_4_;
                iVar45 = auVar34._8_4_;
                if (__n == sVar18) break;
                piVar1 = (int *)((long)*b_00 + sVar18);
                iVar4 = *piVar1;
                iVar5 = piVar1[1];
                iVar6 = piVar1[2];
                iVar7 = piVar1[3];
                piVar1 = (int *)((long)*b + sVar18);
                auVar59._0_4_ = *piVar1 - gap;
                auVar59._4_4_ = piVar1[1] - gap;
                auVar59._8_4_ = piVar1[2] - gap;
                auVar59._12_4_ = piVar1[3] - gap;
                auVar61._0_4_ = iVar4 - open;
                auVar61._4_4_ = iVar5 - open;
                auVar61._8_4_ = iVar6 - open;
                auVar61._12_4_ = iVar7 - open;
                auVar62._0_4_ = -(uint)(auVar61._0_4_ < auVar59._0_4_);
                auVar62._4_4_ = -(uint)(auVar61._4_4_ < auVar59._4_4_);
                auVar62._8_4_ = -(uint)(auVar61._8_4_ < auVar59._8_4_);
                auVar62._12_4_ = -(uint)(auVar61._12_4_ < auVar59._12_4_);
                piVar1 = (int *)((long)pvVar2 + sVar18 + (long)(int)(iVar11 * uVar19) * 0x10);
                auVar48._0_4_ = iVar31 + *piVar1;
                auVar48._4_4_ = iVar32 + piVar1[1];
                auVar48._8_4_ = iVar33 + piVar1[2];
                auVar48._12_4_ = iVar14 + piVar1[3];
                piVar1 = (int *)((long)*ptr_01 + sVar18);
                auVar35._0_4_ = iVar43 + *piVar1;
                auVar35._4_4_ = iVar44 + piVar1[1];
                auVar35._8_4_ = iVar45 + piVar1[2];
                auVar35._12_4_ = auVar34._12_4_ + piVar1[3];
                auVar34 = ~auVar62 & auVar61 | auVar59 & auVar62;
                auVar60._0_4_ = -(uint)(auVar35._0_4_ < auVar25._0_4_);
                auVar60._4_4_ = -(uint)(auVar35._4_4_ < auVar25._4_4_);
                auVar60._8_4_ = -(uint)(auVar35._8_4_ < auVar25._8_4_);
                auVar60._12_4_ = -(uint)(auVar35._12_4_ < auVar25._12_4_);
                auVar25 = auVar25 & auVar60 | ~auVar60 & auVar35;
                auVar36._0_4_ = -(uint)(auVar48._0_4_ < auVar34._0_4_);
                auVar36._4_4_ = -(uint)(auVar48._4_4_ < auVar34._4_4_);
                auVar36._8_4_ = -(uint)(auVar48._8_4_ < auVar34._8_4_);
                auVar36._12_4_ = -(uint)(auVar48._12_4_ < auVar34._12_4_);
                *(undefined1 (*) [16])((long)*b + sVar18) = auVar34;
                auVar34 = ~auVar36 & auVar48 | auVar34 & auVar36;
                *(undefined1 (*) [16])((long)*ptr + sVar18) = auVar34;
                sVar18 = sVar18 + 0x10;
                iVar31 = iVar4;
                iVar32 = iVar5;
                iVar33 = iVar6;
                iVar14 = iVar7;
              }
              auVar37._0_8_ = auVar34._0_8_ << 0x20;
              auVar37._8_8_ = auVar34._8_8_ << 0x20 | auVar34._0_8_ >> 0x20;
              iVar11 = (int)(*ptr_01)[0];
              auVar52._4_4_ = *(int *)((long)*ptr_01 + 4) + iVar43;
              auVar52._0_4_ = iVar11;
              auVar52._8_4_ = (int)(*ptr_01)[1] + iVar44;
              auVar52._12_4_ = *(int *)((long)*ptr_01 + 0xc) + iVar45;
              auVar34._0_4_ = -(uint)(iVar11 < auVar25._0_4_);
              auVar34._4_4_ = -(uint)(auVar52._4_4_ < auVar25._4_4_);
              auVar34._8_4_ = -(uint)(auVar52._8_4_ < auVar25._8_4_);
              auVar34._12_4_ = -(uint)(auVar52._12_4_ < auVar25._12_4_);
              auVar25 = ~auVar34 & auVar52 | auVar25 & auVar34;
              iVar11 = 2;
              while( true ) {
                bVar24 = iVar11 == 0;
                iVar11 = iVar11 + -1;
                auVar28._4_4_ = auVar25._0_4_;
                auVar28._8_4_ = auVar25._4_4_;
                auVar28._12_4_ = auVar25._8_4_;
                if (bVar24) break;
                auVar26._4_4_ = auVar28._4_4_ + uVar12;
                auVar26._0_4_ = uVar23;
                auVar26._8_4_ = auVar28._8_4_ + uVar12;
                auVar26._12_4_ = auVar28._12_4_ + uVar12;
                auVar53._0_4_ = -(uint)((int)uVar23 < auVar28._4_4_);
                auVar53._4_4_ = -(uint)(auVar26._4_4_ < auVar28._8_4_);
                auVar53._8_4_ = -(uint)(auVar26._8_4_ < auVar28._12_4_);
                auVar53._12_4_ = -(uint)(auVar26._12_4_ < auVar25._12_4_);
                auVar25 = auVar25 & auVar53 | ~auVar53 & auVar26;
              }
              auVar28._0_4_ = uVar23;
              auVar49._0_4_ = -(uint)((int)uVar23 < 0);
              auVar49._4_4_ = -(uint)(auVar28._4_4_ < iVar43);
              auVar49._8_4_ = -(uint)(auVar28._8_4_ < iVar44);
              auVar49._12_4_ = -(uint)(auVar28._12_4_ < iVar45);
              auVar25 = ~auVar49 & auVar28 | auVar37 & auVar49;
              auVar38._0_4_ = -(uint)(0 < auVar25._0_4_);
              auVar38._4_4_ = -(uint)(0 < auVar25._4_4_);
              auVar38._8_4_ = -(uint)(0 < auVar25._8_4_);
              auVar38._12_4_ = -(uint)(0 < auVar25._12_4_);
              auVar38 = auVar38 & auVar25;
              sVar18 = 0;
              lVar16 = local_150;
              while( true ) {
                iVar11 = auVar58._0_4_;
                iVar31 = auVar58._4_4_;
                iVar32 = auVar58._8_4_;
                iVar33 = auVar58._12_4_;
                if (__n == sVar18) break;
                auVar25 = *(undefined1 (*) [16])((long)*ptr + sVar18);
                auVar27._0_4_ = auVar28._0_4_ - gap;
                auVar27._4_4_ = auVar28._4_4_ - gap;
                auVar27._8_4_ = auVar28._8_4_ - gap;
                auVar27._12_4_ = auVar28._12_4_ - gap;
                auVar39._0_4_ = auVar38._0_4_ - open;
                auVar39._4_4_ = auVar38._4_4_ - open;
                auVar39._8_4_ = auVar38._8_4_ - open;
                auVar39._12_4_ = auVar38._12_4_ - open;
                auVar54._0_4_ = -(uint)(auVar39._0_4_ < auVar27._0_4_);
                auVar54._4_4_ = -(uint)(auVar39._4_4_ < auVar27._4_4_);
                auVar54._8_4_ = -(uint)(auVar39._8_4_ < auVar27._8_4_);
                auVar54._12_4_ = -(uint)(auVar39._12_4_ < auVar27._12_4_);
                auVar28 = auVar27 & auVar54 | ~auVar54 & auVar39;
                auVar55._0_4_ = -(uint)(auVar28._0_4_ < auVar25._0_4_);
                auVar55._4_4_ = -(uint)(auVar28._4_4_ < auVar25._4_4_);
                auVar55._8_4_ = -(uint)(auVar28._8_4_ < auVar25._8_4_);
                auVar55._12_4_ = -(uint)(auVar28._12_4_ < auVar25._12_4_);
                auVar38 = ~auVar55 & auVar28 | auVar25 & auVar55;
                auVar40._0_4_ = -(uint)(0 < auVar38._0_4_);
                auVar40._4_4_ = -(uint)(0 < auVar38._4_4_);
                auVar40._8_4_ = -(uint)(0 < auVar38._8_4_);
                auVar40._12_4_ = -(uint)(0 < auVar38._12_4_);
                auVar38 = auVar40 & auVar38;
                *(undefined1 (*) [16])((long)*b_00 + sVar18) = auVar38;
                iVar14 = auVar38._0_4_;
                auVar50._0_4_ = -(uint)(iVar14 < auVar51._0_4_);
                iVar43 = auVar38._4_4_;
                auVar50._4_4_ = -(uint)(iVar43 < auVar51._4_4_);
                iVar44 = auVar38._8_4_;
                auVar50._8_4_ = -(uint)(iVar44 < auVar51._8_4_);
                iVar45 = auVar38._12_4_;
                auVar50._12_4_ = -(uint)(iVar45 < auVar51._12_4_);
                auVar51 = ~auVar50 & auVar51 | auVar38 & auVar50;
                auVar56._0_4_ = -(uint)(iVar14 < auVar63._0_4_);
                auVar56._4_4_ = -(uint)(iVar43 < auVar63._4_4_);
                auVar56._8_4_ = -(uint)(iVar44 < auVar63._8_4_);
                auVar56._12_4_ = -(uint)(iVar45 < auVar63._12_4_);
                auVar63 = auVar63 & auVar56 | ~auVar56 & auVar38;
                piVar1 = ((ppVar9->field_4).rowcols)->score_row;
                *(int *)((long)piVar1 + lVar16) = iVar14;
                *(int *)((long)piVar1 + lVar22 * 4 + lVar16) = iVar43;
                *(int *)((long)piVar1 + lVar22 * 8 + lVar16) = iVar44;
                *(int *)((long)piVar1 + lVar22 * 0xc + lVar16) = iVar45;
                auVar57._0_4_ = -(uint)(iVar11 < iVar14);
                auVar57._4_4_ = -(uint)(iVar31 < iVar43);
                auVar57._8_4_ = -(uint)(iVar32 < iVar44);
                auVar57._12_4_ = -(uint)(iVar33 < iVar45);
                auVar58 = ~auVar57 & auVar58 | auVar38 & auVar57;
                sVar18 = sVar18 + 0x10;
                lVar16 = lVar16 + uVar10 * 4;
              }
              auVar29._0_4_ = -(uint)(auVar42._0_4_ < iVar11);
              auVar29._4_4_ = -(uint)(auVar42._4_4_ < iVar31);
              auVar29._8_4_ = -(uint)(auVar42._8_4_ < iVar32);
              auVar29._12_4_ = -(uint)(auVar42._12_4_ < iVar33);
              iVar14 = movmskps((int)lVar16,auVar29);
              if (iVar14 != 0) {
                auVar41._0_4_ = -(uint)(iVar32 < iVar11);
                auVar41._4_4_ = -(uint)(iVar33 < iVar31);
                auVar41._8_4_ = -(uint)(0 < iVar32);
                auVar41._12_4_ = -(uint)(0 < iVar33);
                auVar42 = ~auVar41 & auVar58 >> 0x40 | auVar58 & auVar41;
                uVar13 = auVar42._4_4_;
                uVar47 = auVar42._0_4_;
                uVar46 = -(uint)((int)uVar13 < (int)uVar47);
                local_158 = ~uVar46 & uVar13 | uVar47 & uVar46;
                memcpy(ptr_00,b_00,__n);
                auVar42._4_4_ = local_158;
                auVar42._0_4_ = local_158;
                auVar42._8_4_ = local_158;
                auVar42._12_4_ = local_158;
                local_154 = (int)uVar20;
              }
              local_150 = local_150 + 4;
            }
            uVar13 = (uVar19 & 0x1fffffff) << 2;
            uVar20 = 0;
            while( true ) {
              iVar11 = (int)uVar21;
              if (uVar13 == (uint)uVar20) break;
              if ((*(uint *)((long)*ptr_00 + uVar20 * 4) == local_158) &&
                 (uVar12 = ((uint)uVar20 & 3) * uVar19 + ((uint)(uVar20 >> 2) & 0x3fffffff),
                 (int)uVar12 < iVar11)) {
                uVar21 = (ulong)uVar12;
              }
              uVar20 = uVar20 + 1;
            }
            auVar30._0_4_ = -(uint)(auVar51._0_4_ < (int)uVar23);
            auVar30._4_4_ = -(uint)(auVar51._4_4_ < (int)uVar23);
            auVar30._8_4_ = -(uint)(auVar51._8_4_ < (int)uVar23);
            auVar30._12_4_ = -(uint)(auVar51._12_4_ < (int)uVar23);
            auVar64._0_4_ = -(uint)(iVar8 < auVar63._0_4_);
            auVar64._4_4_ = -(uint)(iVar8 < auVar63._4_4_);
            auVar64._8_4_ = -(uint)(iVar8 < auVar63._8_4_);
            auVar64._12_4_ = -(uint)(iVar8 < auVar63._12_4_);
            iVar8 = movmskps(uVar13,auVar64 | auVar30);
            if (iVar8 != 0) {
              *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
              local_158 = 0;
              local_154 = 0;
              iVar11 = 0;
            }
            ppVar9->score = local_158;
            ppVar9->end_query = iVar11;
            ppVar9->end_ref = local_154;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(b_00);
            parasail_free(ptr);
            parasail_free(b);
            return ppVar9;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar17 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_scan_profile_sse2_128_32",pcVar17);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32_rpl(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vF = _mm_max_epi32_rpl(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32_rpl(vHt, vF);
        vH = _mm_max_epi32_rpl(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32_rpl(vHt, vF);
            vH = _mm_max_epi32_rpl(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}